

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O3

void __thiscall slang::IntervalMapDetails::Path::moveLeft(Path *this,uint32_t level)

{
  size_type sVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  pointer pEVar5;
  uint uVar6;
  ulong uVar7;
  Entry local_28;
  
  uVar2 = (ulong)level;
  sVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if ((sVar1 == 0) ||
     (pEVar5 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     uVar7 = uVar2, pEVar5->size <= pEVar5->offset)) {
    uVar7 = 0;
    if ((int)sVar1 - 1U < level) {
      local_28.node = (void *)0x0;
      local_28.size = 0;
      local_28.offset = 0;
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
      resizeImpl<slang::IntervalMapDetails::Path::Entry>
                ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this,(ulong)(level + 1),
                 &local_28);
    }
  }
  else {
    do {
      uVar7 = (ulong)((int)uVar7 - 1);
    } while (pEVar5[uVar7].offset == 0);
  }
  pEVar5 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar6 = pEVar5[uVar7].offset - 1;
  pEVar5[uVar7].offset = uVar6;
  uVar3 = *(ulong *)((long)pEVar5[uVar7].node + (ulong)uVar6 * 8);
  uVar6 = (int)uVar7 + 1;
  if (uVar6 != level) {
    do {
      uVar4 = (uint)uVar3 & 0x3f;
      pEVar5 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      pEVar5[uVar6].node = (void *)(uVar3 & 0xffffffffffffffc0);
      pEVar5[uVar6].size = uVar4 + 1;
      pEVar5[uVar6].offset = uVar4;
      uVar3 = *(ulong *)((long)(uVar3 & 0xffffffffffffffc0) + (ulong)uVar4 * 8);
      uVar6 = uVar6 + 1;
    } while (level != uVar6);
    pEVar5 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  }
  uVar6 = (uint)uVar3 & 0x3f;
  pEVar5[uVar2].node = (void *)(uVar3 & 0xffffffffffffffc0);
  pEVar5[uVar2].size = uVar6 + 1;
  pEVar5[uVar2].offset = uVar6;
  return;
}

Assistant:

void Path::moveLeft(uint32_t level) {
    SLANG_ASSERT(level);

    // Go up the tree until we find a node where we can go left.
    uint32_t l = 0;
    if (valid()) {
        l = level - 1;
        while (path[l].offset == 0) {
            SLANG_ASSERT(l);
            --l;
        }
    }
    else if (height() < level) {
        path.resize(level + 1, Entry(nullptr, 0, 0));
    }

    --path[l].offset;

    // Get the rightmost node of the new subtree.
    NodeRef nodeRef = childAt(l);
    for (++l; l != level; ++l) {
        path[l] = Entry(nodeRef, nodeRef.size() - 1);
        nodeRef = nodeRef.childAt(nodeRef.size() - 1);
    }
    path[l] = Entry(nodeRef, nodeRef.size() - 1);
}